

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O0

void __thiscall wasm::PrintExpressionContents::visitPop(PrintExpressionContents *this,Pop *curr)

{
  ostream *poVar1;
  Pop *curr_local;
  PrintExpressionContents *this_local;
  
  poVar1 = prepareColor(this->o);
  std::operator<<(poVar1,"pop ");
  printType(this,(Type)(curr->super_SpecificExpression<(wasm::Expression::Id)40>).super_Expression.
                       type.id);
  restoreNormalColor(this->o);
  return;
}

Assistant:

void visitPop(Pop* curr) {
    prepareColor(o) << "pop ";
    printType(curr->type);
    restoreNormalColor(o);
  }